

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

bool __thiscall cmGlobalGenerator::IsExcluded(cmGlobalGenerator *this,cmGeneratorTarget *target)

{
  bool bVar1;
  TargetType TVar2;
  allocator<char> local_39;
  string local_38;
  
  TVar2 = cmGeneratorTarget::GetType(target);
  bVar1 = true;
  if (TVar2 != INTERFACE_LIBRARY) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"EXCLUDE_FROM_ALL",&local_39);
    bVar1 = cmGeneratorTarget::GetPropertyAsBool(target,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return bVar1;
}

Assistant:

bool cmGlobalGenerator::IsExcluded(cmGeneratorTarget* target) const
{
  return target->GetType() == cmStateEnums::INTERFACE_LIBRARY ||
    target->GetPropertyAsBool("EXCLUDE_FROM_ALL");
}